

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

string * __thiscall
helics::MessageFederateManager::localQuery_abi_cxx11_
          (string *__return_storage_ptr__,MessageFederateManager *this,string_view queryStr)

{
  Endpoint *this_00;
  bool bVar1;
  string *psVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  shared_handle local_b8;
  const_iterator __begin0;
  const_iterator __end0;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __y._M_str = "endpoints";
  __y._M_len = 9;
  bVar1 = std::operator==(queryStr,__y);
  if (bVar1) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock_shared(&local_b8,&this->mLocalEndpoints);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"[",(allocator<char> *)&local_70);
    gmlc::containers::StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::
    begin(&__begin0,&(local_b8.data)->dataStorage);
    gmlc::containers::StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::
    end(&__end0,&(local_b8.data)->dataStorage);
    while ((this_00 = __begin0.ptr, __begin0.offset != __end0.offset || (__begin0.vec != __end0.vec)
           )) {
      psVar2 = Interface::getName_abi_cxx11_(&(__begin0.ptr)->super_Interface);
      if (psVar2->_M_string_length != 0) {
        psVar2 = Interface::getName_abi_cxx11_(&this_00->super_Interface);
        std::__cxx11::string::string
                  ((string *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2);
        generateJsonQuotedString(&local_70,&local_50);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_d8,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(&local_d8,',');
      }
      gmlc::containers::BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>::
      operator++(&__begin0);
    }
    if (local_d8._M_string_length < 2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_d8,']');
    }
    else {
      local_d8._M_dataplus._M_p[local_d8._M_string_length - 1] = ']';
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::shared_lock<std::shared_mutex>::~shared_lock(&local_b8.m_handle_lock);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MessageFederateManager::localQuery(std::string_view queryStr) const
{
    std::string ret;
    if (queryStr == "endpoints") {
        ret = generateStringVector_if(
            mLocalEndpoints.lock_shared(),
            [](const auto& info) { return info.getName(); },
            [](const auto& info) { return (!info.getName().empty()); });
    }
    return ret;
}